

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive-list.h
# Opt level: O2

ssize_t __thiscall
wabt::intrusive_list<(anonymous_namespace)::TestObject>::splice
          (intrusive_list<(anonymous_namespace)::TestObject> *this,int __fdin,__off64_t *__offin,
          int __fdout,__off64_t *__offout,size_t __len,uint __flags)

{
  iterator rhs;
  iterator pos;
  intrusive_list<(anonymous_namespace)::TestObject> *piVar1;
  bool bVar2;
  undefined7 extraout_var;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000034;
  iterator pos_00;
  undefined1 in_stack_0000000c [12];
  iterator local_48;
  
  pos.list_._4_4_ = in_register_00000034;
  pos.list_._0_4_ = __fdin;
  pos_00.list_._4_4_ = in_register_0000000c;
  pos_00.list_._0_4_ = __fdout;
  rhs._4_12_ = in_stack_0000000c;
  rhs.list_._0_4_ = __flags;
  local_48.list_ = (intrusive_list<(anonymous_namespace)::TestObject> *)__offout;
  local_48.node_ = (TestObject *)__len;
  while( true ) {
    bVar2 = iterator::operator!=(&local_48,rhs);
    piVar1 = local_48.list_;
    if (!bVar2) break;
    iterator::operator++(&local_48);
    pos_00.node_ = (TestObject *)piVar1;
    extract((intrusive_list<(anonymous_namespace)::TestObject> *)&stack0xffffffffffffffc8,pos_00);
    pos.node_ = (TestObject *)__offin;
    insert(this,pos,(unique_ptr<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>_>
                     *)&stack0xffffffffffffffc8);
    std::
    unique_ptr<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>_>
    ::~unique_ptr((unique_ptr<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>_>
                   *)&stack0xffffffffffffffc8);
  }
  return CONCAT71(extraout_var,bVar2);
}

Assistant:

inline void intrusive_list<T>::splice(iterator pos,
                                      intrusive_list& other,
                                      iterator first,
                                      iterator last) {
  while (first != last)
    insert(pos, other.extract(first++));
}